

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knetfile.c
# Opt level: O0

int socket_connect(char *host,char *port)

{
  FILE *__stream;
  int iVar1;
  char *pcVar2;
  addrinfo *local_70;
  addrinfo *res;
  addrinfo hints;
  linger lng;
  int fd;
  int on;
  int ai_err;
  char *port_local;
  char *host_local;
  
  lng.l_linger = 1;
  memset((void *)((long)&hints.ai_next + 4),0,8);
  local_70 = (addrinfo *)0x0;
  memset(&res,0,0x30);
  res._4_4_ = 0;
  hints.ai_flags = 1;
  iVar1 = getaddrinfo(host,port,(addrinfo *)&res,&local_70);
  __stream = _stderr;
  if (iVar1 == 0) {
    lng.l_onoff = socket(local_70->ai_family,local_70->ai_socktype,local_70->ai_protocol);
    if (lng.l_onoff == -1) {
      perror("socket");
      freeaddrinfo(local_70);
      host_local._4_4_ = -1;
    }
    else {
      iVar1 = setsockopt(lng.l_onoff,1,2,&lng.l_linger,4);
      if (iVar1 == -1) {
        perror("setsockopt");
        freeaddrinfo(local_70);
        host_local._4_4_ = -1;
      }
      else {
        iVar1 = setsockopt(lng.l_onoff,1,0xd,(void *)((long)&hints.ai_next + 4),8);
        if (iVar1 == -1) {
          perror("setsockopt");
          freeaddrinfo(local_70);
          host_local._4_4_ = -1;
        }
        else {
          iVar1 = connect(lng.l_onoff,local_70->ai_addr,local_70->ai_addrlen);
          if (iVar1 == 0) {
            freeaddrinfo(local_70);
            host_local._4_4_ = lng.l_onoff;
          }
          else {
            perror("connect");
            freeaddrinfo(local_70);
            host_local._4_4_ = -1;
          }
        }
      }
    }
  }
  else {
    pcVar2 = gai_strerror(iVar1);
    fprintf(__stream,"can\'t resolve %s:%s: %s\n",host,port,pcVar2);
    host_local._4_4_ = -1;
  }
  return host_local._4_4_;
}

Assistant:

static int socket_connect(const char *host, const char *port)
{
#define __err_connect(func) do { perror(func); freeaddrinfo(res); return -1; } while (0)

	int ai_err, on = 1, fd;
	struct linger lng = { 0, 0 };
	struct addrinfo hints, *res = 0;
	memset(&hints, 0, sizeof(struct addrinfo));
	hints.ai_family = AF_UNSPEC;
	hints.ai_socktype = SOCK_STREAM;
	/* In Unix/Mac, getaddrinfo() is the most convenient way to get
	 * server information. */
	if ((ai_err = getaddrinfo(host, port, &hints, &res)) != 0) { fprintf(stderr, "can't resolve %s:%s: %s\n", host, port, gai_strerror(ai_err)); return -1; }
	if ((fd = socket(res->ai_family, res->ai_socktype, res->ai_protocol)) == -1) __err_connect("socket");
	/* The following two setsockopt() are used by ftplib
	 * (http://nbpfaus.net/~pfau/ftplib/). I am not sure if they
	 * necessary. */
	if (setsockopt(fd, SOL_SOCKET, SO_REUSEADDR, &on, sizeof(on)) == -1) __err_connect("setsockopt");
	if (setsockopt(fd, SOL_SOCKET, SO_LINGER, &lng, sizeof(lng)) == -1) __err_connect("setsockopt");
	if (connect(fd, res->ai_addr, res->ai_addrlen) != 0) __err_connect("connect");
	freeaddrinfo(res);
	return fd;
}